

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnIfExceptExpr
          (BinaryReaderIR *this,Type sig_type,Index except_index)

{
  char *__s;
  Offset OVar1;
  Expr *pEVar2;
  Result RVar3;
  pointer __p;
  undefined1 local_b0 [8];
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_48;
  Type local_3c;
  Expr *local_38;
  
  local_3c = sig_type;
  MakeUnique<wabt::IfExceptExpr>();
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  local_b0 = (undefined1  [8])__s;
  loc.filename.size_ = OVar1;
  Var::Var((Var *)((long)&loc.field_1 + 8),except_index,(Location *)local_b0);
  Var::operator=((Var *)&local_38[5].super_intrusive_list_base<wabt::Expr>.prev_,
                 (Var *)((long)&loc.field_1 + 8));
  Var::~Var((Var *)((long)&loc.field_1 + 8));
  SetBlockDeclaration(this,(BlockDeclaration *)&local_38[1].loc.filename.size_,local_3c);
  pEVar2 = local_38;
  local_38 = (Expr *)0x0;
  local_48._M_head_impl = pEVar2;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_48);
  if (local_48._M_head_impl != (Expr *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar3.enum_ != Error) {
    PushLabel(this,IfExcept,(ExprList *)&pEVar2[3].loc.filename.size_,(Expr *)0x0);
  }
  if (local_38 != (Expr *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnIfExceptExpr(Type sig_type, Index except_index) {
  auto expr = MakeUnique<IfExceptExpr>();
  expr->except_var = Var(except_index, GetLocation());
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::IfExcept, expr_list);
  return Result::Ok;
}